

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3p_test.cc
# Opt level: O3

bool is_valid(CameraPose *pose,
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *x,vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *X)

{
  long lVar1;
  double *pdVar2;
  pointer pMVar3;
  pointer pMVar4;
  double dVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  
  pMVar3 = (x->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(x->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3;
  if (lVar7 == 0) {
    bVar6 = true;
  }
  else {
    lVar7 = lVar7 >> 3;
    uVar8 = lVar7 * -0x5555555555555555;
    pMVar4 = (X->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar9 = 0;
    uVar10 = 1;
    bVar6 = false;
    do {
      auVar15 = *(undefined1 (*) [16])
                 ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar9);
      dVar16 = *(double *)
                ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar9 + 0x10);
      dVar17 = dVar16 * dVar16 + auVar15._8_8_ * auVar15._8_8_ + auVar15._0_8_ * auVar15._0_8_;
      if (0.0 < dVar17) {
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar17;
        auVar13 = sqrtpd(auVar13,auVar13);
        auVar14._0_8_ = auVar13._0_8_;
        dVar16 = dVar16 / auVar14._0_8_;
        auVar14._8_8_ = auVar14._0_8_;
        auVar15 = divpd(auVar15,auVar14);
      }
      dVar17 = *(double *)
                ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar9);
      pdVar2 = (double *)
               ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar9 + 8);
      dVar18 = *pdVar2;
      dVar5 = pdVar2[1];
      auVar19._0_8_ =
           (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] * dVar5 +
           dVar18 * (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[3] +
           dVar17 * (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0] +
           (pose->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      auVar19._8_8_ =
           (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7] * dVar5 +
           dVar18 * (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[4] +
           dVar17 * (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1] +
           (pose->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      dVar17 = dVar5 * (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[8] +
               (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] * dVar18 +
               (pose->R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] * dVar17 +
               (pose->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
      dVar18 = dVar17 * dVar17 + auVar19._8_8_ * auVar19._8_8_ + auVar19._0_8_ * auVar19._0_8_;
      if (0.0 < dVar18) {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar18;
        auVar13 = sqrtpd(auVar11,auVar11);
        auVar12._0_8_ = auVar13._0_8_;
        dVar17 = dVar17 / auVar12._0_8_;
        auVar12._8_8_ = auVar12._0_8_;
        auVar19 = divpd(auVar19,auVar12);
      }
      if (1e-08 < ABS(1.0 - (auVar15._8_8_ * auVar19._8_8_ + auVar15._0_8_ * auVar19._0_8_ +
                            dVar16 * dVar17))) {
        return bVar6;
      }
      bVar6 = uVar8 < uVar10 || uVar8 - uVar10 == 0;
      lVar9 = lVar9 + 0x18;
      lVar1 = (lVar7 * 0x5555555555555555 - (ulong)(uVar8 == 0)) + uVar10;
      uVar10 = uVar10 + 1;
    } while (lVar1 != 0);
  }
  return bVar6;
}

Assistant:

bool is_valid(const CameraPose &pose, const std::vector<Eigen::Vector3d> &x, const std::vector<Eigen::Vector3d> &X) {
    for(int k = 0; k < x.size(); ++k) {
        Eigen::Vector3d z = pose.R * X[k] + pose.t;
        double res = std::abs(1 - x[k].normalized().dot(z.normalized()));
        if(res > 1e-8) {        
            return false;
        }
    }
    return true;
}